

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd_test.c
# Opt level: O1

void test_sfd_accept(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_socket local_2c;
  int local_28;
  nng_socket s2;
  int fds [2];
  nng_socket s1;
  nng_listener l;
  
  nVar1 = nng_socket_pair(&local_28);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x4f,"%s: expected success, got %s (%d)","nng_socket_pair(fds)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_pair1_open((nng_socket *)fds);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                           ,0x51,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar3,
                           nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_pair1_open(&local_2c);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                             ,0x52,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",
                             pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_listener_create((nng_listener *)(fds + 1),(nng_socket)fds[0],"socket://");
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                               ,0x53,"%s: expected success, got %s (%d)",
                               "nng_listener_create(&l, s1, \"socket://\")",pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_listener_start((nng_listener)fds[1],0);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                 ,0x54,"%s: expected success, got %s (%d)",
                                 "nng_listener_start(l, 0)",pcVar3,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_listener_set_int((nng_listener)fds[1],"socket:fd",local_28);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                   ,0x55,"%s: expected success, got %s (%d)",
                                   "nng_listener_set_int(l, NNG_OPT_SOCKET_FD, fds[0])",pcVar3,nVar1
                                  );
            if (iVar2 != 0) {
              nuts_sleep(10);
              nVar1 = nng_socket_close((nng_socket)fds[0]);
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                     ,0x57,"%s: expected success, got %s (%d)",
                                     "nng_socket_close(s1)",pcVar3,nVar1);
              if (iVar2 != 0) {
                close(s2.id);
                return;
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_sfd_accept(void)
{
#ifdef NNG_HAVE_SOCKETPAIR
	nng_socket   s1, s2;
	nng_listener l;
	int          fds[2];

	NUTS_PASS(nng_socket_pair(fds));
	// make sure we won't have to deal with SIGPIPE - EPIPE is better
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_PASS(nng_listener_create(&l, s1, "socket://"));
	NUTS_PASS(nng_listener_start(l, 0));
	NUTS_PASS(nng_listener_set_int(l, NNG_OPT_SOCKET_FD, fds[0]));
	NUTS_SLEEP(10);
	NUTS_CLOSE(s1);
	close(fds[1]);
#else
	NUTS_SKIP("no socketpair");
#endif
}